

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation_statistics_helper.cpp
# Opt level: O3

RelationStats *
duckdb::RelationStatisticsHelper::ExtractGetStats
          (RelationStats *__return_storage_ptr__,LogicalGet *get,ClientContext *context)

{
  pointer *ppDVar1;
  element_type *peVar2;
  table_statistics_t p_Var3;
  iterator iVar4;
  pointer pbVar5;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var6;
  byte bVar7;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var8;
  undefined8 uVar9;
  int iVar10;
  undefined4 extraout_var;
  vector<duckdb::ColumnIndex,_true> *this;
  const_reference pvVar11;
  pointer this_00;
  idx_t iVar12;
  __uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
  *p_Var13;
  long *plVar14;
  type filter;
  type base_stats;
  pointer pTVar15;
  _Base_ptr p_Var16;
  ulong uVar17;
  _Alloc_hider *p_Var18;
  __uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
  _Var19;
  element_type *peVar20;
  idx_t iVar21;
  size_type __n;
  undefined1 auVar22 [16];
  double dVar23;
  string column_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  optional_ptr<duckdb::TableCatalogEntry,_true> catalog_table;
  DistinctCount column_distinct_count;
  string name;
  DistinctCount column_distinct_count_1;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_110;
  idx_t local_108;
  undefined1 local_100 [32];
  _Base_ptr local_e0;
  undefined1 local_d8 [32];
  undefined1 local_b8 [16];
  long lStack_a8;
  _Alloc_hider local_a0;
  size_type sStack_98;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  TableCatalogEntry *local_68;
  DistinctCount local_60;
  __node_base *local_50 [2];
  __node_base local_40 [2];
  
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->cardinality = 1;
  __return_storage_ptr__->filter_strength = 1.0;
  __return_storage_ptr__->stats_initialized = false;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->table_name).field_2;
  (__return_storage_ptr__->table_name)._M_string_length = 0;
  (__return_storage_ptr__->table_name).field_2._M_local_buf[0] = '\0';
  local_90._0_8_ = context;
  iVar10 = (*(get->super_LogicalOperator)._vptr_LogicalOperator[7])(get,context);
  local_108 = CONCAT44(extraout_var,iVar10);
  local_110._M_head_impl = (BaseStatistics *)0x0;
  local_b8._0_8_ = LogicalGet::GetTable(get);
  local_90._8_8_ = local_80._M_local_buf + 8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)(local_90 + 8),"some table","");
  if ((TableCatalogEntry *)local_b8._0_8_ != (TableCatalogEntry *)0x0) {
    optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid
              ((optional_ptr<duckdb::TableCatalogEntry,_true> *)local_b8);
    ::std::__cxx11::string::_M_assign((string *)(local_90 + 8));
    ::std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->table_name);
  }
  local_68 = (TableCatalogEntry *)LogicalGet::GetTable(get);
  this = LogicalGet::GetColumnIds(get);
  if ((this->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_e0 = (_Base_ptr)&__return_storage_ptr__->column_names;
    peVar2 = (element_type *)(local_100 + 0x10);
    __n = 0;
    do {
      pvVar11 = vector<duckdb::ColumnIndex,_true>::operator[](this,__n);
      uVar17 = pvVar11->index;
      p_Var3 = (get->function).statistics;
      if (p_Var3 == (table_statistics_t)0x0) {
LAB_017441a2:
        local_60.distinct_count = local_108;
        local_60.from_hll = false;
        iVar4._M_current =
             (__return_storage_ptr__->column_distinct_count).
             super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
             super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->column_distinct_count).
            super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
            super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::DistinctCount,std::allocator<duckdb::DistinctCount>>::
          _M_realloc_insert<duckdb::DistinctCount_const&>
                    ((vector<duckdb::DistinctCount,std::allocator<duckdb::DistinctCount>> *)
                     __return_storage_ptr__,iVar4,&local_60);
        }
        else {
          (iVar4._M_current)->distinct_count = local_108;
          *(ulong *)&(iVar4._M_current)->from_hll = (ulong)(uint7)local_60._9_7_ << 8;
          ppDVar1 = &(__return_storage_ptr__->column_distinct_count).
                     super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                     super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppDVar1 = *ppDVar1 + 1;
        }
        local_100._0_8_ = peVar2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"column","");
        if (uVar17 < (ulong)((long)(get->names).
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(get->names).
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          ::std::__cxx11::string::_M_assign((string *)local_100);
        }
        (*(get->super_LogicalOperator)._vptr_LogicalOperator[3])(local_50,get);
        plVar14 = (long *)::std::__cxx11::string::append((char *)local_50);
        local_b8._8_8_ = &local_a0;
        p_Var18 = (_Alloc_hider *)(plVar14 + 2);
        if ((_Alloc_hider *)*plVar14 == p_Var18) {
          local_a0._M_p = p_Var18->_M_p;
          sStack_98 = plVar14[3];
        }
        else {
          local_a0._M_p = p_Var18->_M_p;
          local_b8._8_8_ = (_Alloc_hider *)*plVar14;
        }
        lStack_a8 = plVar14[1];
        *plVar14 = (long)p_Var18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        p_Var13 = (__uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                   *)::std::__cxx11::string::_M_append(local_b8 + 8,local_100._0_8_);
        local_d8._0_8_ = (long)local_d8 + 0x10;
        _Var19._M_t.
        super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
        .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl =
             (tuple<duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
              )(p_Var13 + 2);
        if ((_Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
             )p_Var13->_M_t ==
            (_Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
             )_Var19._M_t.
              super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
              .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl) {
          local_d8._16_8_ =
               *(undefined8 *)
                _Var19._M_t.
                super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl;
          local_d8._24_8_ = p_Var13[3]._M_t;
        }
        else {
          local_d8._16_8_ =
               *(undefined8 *)
                _Var19._M_t.
                super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl;
          local_d8._0_8_ =
               (_Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                )p_Var13->_M_t;
        }
        local_d8._8_8_ = p_Var13[1]._M_t;
        p_Var13->_M_t =
             _Var19._M_t.
             super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
             .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl;
        p_Var13[1]._M_t =
             (tuple<duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
              )0x0;
        *(undefined1 *)&p_Var13[2]._M_t = 0;
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
        if ((element_type *)local_d8._0_8_ != (element_type *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
        if ((_Alloc_hider *)local_b8._8_8_ != &local_a0) {
          operator_delete((void *)local_b8._8_8_);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        peVar20 = (element_type *)local_100._0_8_;
        if ((element_type *)local_100._0_8_ != peVar2) {
LAB_01744353:
          operator_delete(peVar20);
        }
      }
      else {
        (*p_Var3)((ClientContext *)local_100,(FunctionData *)local_90._0_8_,
                  (column_t)
                  (get->bind_data).
                  super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                  .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl);
        uVar9 = local_100._0_8_;
        _Var8._M_head_impl = local_110._M_head_impl;
        local_100._0_8_ = (element_type *)0x0;
        local_110._M_head_impl = (BaseStatistics *)uVar9;
        if ((element_type *)_Var8._M_head_impl != (element_type *)0x0) {
          BaseStatistics::~BaseStatistics(_Var8._M_head_impl);
          operator_delete(_Var8._M_head_impl);
          uVar9 = local_100._0_8_;
          if ((element_type *)local_100._0_8_ != (element_type *)0x0) {
            BaseStatistics::~BaseStatistics((BaseStatistics *)local_100._0_8_);
            operator_delete((void *)uVar9);
          }
        }
        if ((local_68 == (TableCatalogEntry *)0x0) ||
           ((element_type *)local_110._M_head_impl == (element_type *)0x0)) goto LAB_017441a2;
        this_00 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                *)&local_110);
        iVar12 = BaseStatistics::GetDistinctCount(this_00);
        local_b8._8_8_ = iVar12 + (iVar12 == 0);
        lStack_a8 = CONCAT71(lStack_a8._1_7_,1);
        iVar4._M_current =
             (__return_storage_ptr__->column_distinct_count).
             super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
             super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->column_distinct_count).
            super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
            super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::DistinctCount,std::allocator<duckdb::DistinctCount>>::
          _M_realloc_insert<duckdb::DistinctCount_const&>
                    ((vector<duckdb::DistinctCount,std::allocator<duckdb::DistinctCount>> *)
                     __return_storage_ptr__,iVar4,(DistinctCount *)(local_b8 + 8));
        }
        else {
          (iVar4._M_current)->distinct_count = local_b8._8_8_;
          *(long *)&(iVar4._M_current)->from_hll = lStack_a8;
          ppDVar1 = &(__return_storage_ptr__->column_distinct_count).
                     super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                     super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppDVar1 = *ppDVar1 + 1;
        }
        local_d8._0_8_ = (long)local_d8 + 0x10;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d8,local_90._8_8_,
                   (char *)(local_80._M_allocated_capacity + local_90._8_8_));
        ::std::__cxx11::string::append((char *)local_d8);
        pbVar5 = (get->names).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(get->names).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5) <= uVar17)
        {
          ::std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar17);
        }
        plVar14 = (long *)::std::__cxx11::string::_M_append
                                    (local_d8,(ulong)pbVar5[uVar17]._M_dataplus._M_p);
        peVar20 = (element_type *)(plVar14 + 2);
        if ((element_type *)*plVar14 == peVar20) {
          local_100._16_8_ =
               *(undefined8 *)&peVar20->super_enable_shared_from_this<duckdb::ClientContext>;
          local_100._24_8_ = plVar14[3];
          local_100._0_8_ = peVar2;
        }
        else {
          local_100._16_8_ =
               *(undefined8 *)&peVar20->super_enable_shared_from_this<duckdb::ClientContext>;
          local_100._0_8_ = (element_type *)*plVar14;
        }
        local_100._8_8_ = plVar14[1];
        *plVar14 = (long)peVar20;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
        if ((element_type *)local_100._0_8_ != peVar2) {
          operator_delete((void *)local_100._0_8_);
        }
        peVar20 = (element_type *)local_d8._0_8_;
        if ((element_type *)local_d8._0_8_ != (element_type *)(local_d8 + 0x10)) goto LAB_01744353;
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->
                                 super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                 ).
                                 super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->
                                 super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                 ).
                                 super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  _Var8._M_head_impl = local_110._M_head_impl;
  iVar12 = local_108;
  if ((get->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_110._M_head_impl = (BaseStatistics *)0x0;
    if ((element_type *)_Var8._M_head_impl != (element_type *)0x0) {
      BaseStatistics::~BaseStatistics(_Var8._M_head_impl);
      operator_delete(_Var8._M_head_impl);
    }
    p_Var16 = (get->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_e0 = &(get->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_header;
    iVar21 = local_108;
    if (p_Var16 != local_e0) {
      bVar7 = 0;
      do {
        _Var6._M_head_impl =
             (get->bind_data).
             super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
        if ((_Var6._M_head_impl != (FunctionData *)0x0) &&
           (p_Var3 = (get->function).statistics, p_Var3 != (table_statistics_t)0x0)) {
          (*p_Var3)((ClientContext *)local_100,(FunctionData *)local_90._0_8_,
                    (column_t)_Var6._M_head_impl);
          uVar9 = local_100._0_8_;
          _Var8._M_head_impl = local_110._M_head_impl;
          local_100._0_8_ = (element_type *)0x0;
          local_110._M_head_impl = (BaseStatistics *)uVar9;
          if ((element_type *)_Var8._M_head_impl != (element_type *)0x0) {
            BaseStatistics::~BaseStatistics(_Var8._M_head_impl);
            operator_delete(_Var8._M_head_impl);
            uVar9 = local_100._0_8_;
            if ((element_type *)local_100._0_8_ != (element_type *)0x0) {
              BaseStatistics::~BaseStatistics((BaseStatistics *)local_100._0_8_);
              operator_delete((void *)uVar9);
            }
          }
        }
        if ((element_type *)local_110._M_head_impl != (element_type *)0x0) {
          iVar12 = *(idx_t *)(p_Var16 + 1);
          filter = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                   operator*((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                              *)&p_Var16[1]._M_parent);
          base_stats = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                       ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                    *)&local_110);
          iVar12 = InspectTableFilter(local_108,iVar12,filter,base_stats);
          if (iVar12 <= iVar21) {
            iVar21 = iVar12;
          }
        }
        pTVar15 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                  operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                              *)&p_Var16[1]._M_parent);
        bVar7 = bVar7 | pTVar15->filter_type != OPTIONAL_FILTER;
        p_Var16 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var16);
      } while (p_Var16 != local_e0);
      if ((bool)(iVar21 == local_108 & bVar7)) {
        auVar22._8_4_ = (int)(local_108 >> 0x20);
        auVar22._0_8_ = local_108;
        auVar22._12_4_ = 0x45300000;
        dVar23 = ((auVar22._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_108) - 4503599627370496.0)) * 0.2;
        uVar17 = (ulong)dVar23;
        uVar17 = (long)(dVar23 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17;
        iVar21 = uVar17 + (uVar17 == 0);
      }
    }
    iVar12 = local_108;
    if (local_108 != 0) {
      iVar12 = iVar21;
    }
  }
  __return_storage_ptr__->cardinality = iVar12;
  (get->super_LogicalOperator).estimated_cardinality = iVar12;
  (get->super_LogicalOperator).has_estimated_cardinality = true;
  __return_storage_ptr__->stats_initialized = true;
  if ((char *)local_90._8_8_ != local_80._M_local_buf + 8) {
    operator_delete((void *)local_90._8_8_);
  }
  _Var8._M_head_impl = local_110._M_head_impl;
  if ((element_type *)local_110._M_head_impl != (element_type *)0x0) {
    BaseStatistics::~BaseStatistics(local_110._M_head_impl);
    operator_delete(_Var8._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

RelationStats RelationStatisticsHelper::ExtractGetStats(LogicalGet &get, ClientContext &context) {
	auto return_stats = RelationStats();

	auto base_table_cardinality = get.EstimateCardinality(context);
	auto cardinality_after_filters = base_table_cardinality;
	unique_ptr<BaseStatistics> column_statistics;

	auto catalog_table = get.GetTable();
	auto name = string("some table");
	if (catalog_table) {
		name = catalog_table->name;
		return_stats.table_name = name;
	}

	// if we can get the catalog table, then our column statistics will be accurate
	// parquet readers etc. will still return statistics, but they initialize distinct column
	// counts to 0.
	// TODO: fix this, some file formats can encode distinct counts, we don't want to rely on
	//  getting a catalog table to know that we can use statistics.
	bool have_catalog_table_statistics = false;
	if (get.GetTable()) {
		have_catalog_table_statistics = true;
	}

	// first push back basic distinct counts for each column (if we have them).
	auto &column_ids = get.GetColumnIds();
	for (idx_t i = 0; i < column_ids.size(); i++) {
		auto column_id = column_ids[i].GetPrimaryIndex();
		bool have_distinct_count_stats = false;
		if (get.function.statistics) {
			column_statistics = get.function.statistics(context, get.bind_data.get(), column_id);
			if (column_statistics && have_catalog_table_statistics) {
				auto distinct_count = MaxValue<idx_t>(1, column_statistics->GetDistinctCount());
				auto column_distinct_count = DistinctCount({distinct_count, true});
				return_stats.column_distinct_count.push_back(column_distinct_count);
				return_stats.column_names.push_back(name + "." + get.names.at(column_id));
				have_distinct_count_stats = true;
			}
		}
		if (!have_distinct_count_stats) {
			// currently treating the cardinality as the distinct count.
			// the cardinality estimator will update these distinct counts based
			// on the extra columns that are joined on.
			auto column_distinct_count = DistinctCount({cardinality_after_filters, false});
			return_stats.column_distinct_count.push_back(column_distinct_count);
			auto column_name = string("column");
			if (column_id < get.names.size()) {
				column_name = get.names.at(column_id);
			}
			return_stats.column_names.push_back(get.GetName() + "." + column_name);
		}
	}

	if (!get.table_filters.filters.empty()) {
		column_statistics = nullptr;
		bool has_non_optional_filters = false;
		for (auto &it : get.table_filters.filters) {
			if (get.bind_data && get.function.statistics) {
				column_statistics = get.function.statistics(context, get.bind_data.get(), it.first);
			}

			if (column_statistics) {
				idx_t cardinality_with_filter =
				    InspectTableFilter(base_table_cardinality, it.first, *it.second, *column_statistics);
				cardinality_after_filters = MinValue(cardinality_after_filters, cardinality_with_filter);
			}

			if (it.second->filter_type != TableFilterType::OPTIONAL_FILTER) {
				has_non_optional_filters = true;
			}
		}
		// if the above code didn't find an equality filter (i.e country_code = "[us]")
		// and there are other table filters (i.e cost > 50), use default selectivity.
		bool has_equality_filter = (cardinality_after_filters != base_table_cardinality);
		if (!has_equality_filter && has_non_optional_filters) {
			cardinality_after_filters = MaxValue<idx_t>(
			    LossyNumericCast<idx_t>(double(base_table_cardinality) * RelationStatisticsHelper::DEFAULT_SELECTIVITY),
			    1U);
		}
		if (base_table_cardinality == 0) {
			cardinality_after_filters = 0;
		}
	}
	return_stats.cardinality = cardinality_after_filters;
	// update the estimated cardinality of the get as well.
	// This is not updated during plan reconstruction.
	get.estimated_cardinality = cardinality_after_filters;
	get.has_estimated_cardinality = true;
	D_ASSERT(base_table_cardinality >= cardinality_after_filters);
	return_stats.stats_initialized = true;
	return return_stats;
}